

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLifetimeTests.cpp
# Opt level: O0

void __thiscall
deqp::gls::LifetimeTests::details::TestBase::TestBase
          (TestBase *this,char *name,char *description,Context *ctx)

{
  deUint32 seed;
  TestContext *pTVar1;
  Functions *gl;
  TestLog *log;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  Context *ctx_local;
  char *description_local;
  char *name_local;
  TestBase *this_local;
  
  pTVar1 = Context::getTestContext(ctx);
  tcu::TestCase::TestCase(&this->super_TestCase,pTVar1,name,description);
  gl = Context::gl(ctx);
  Context::log(ctx,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
  glu::CallLogWrapper::CallLogWrapper(&this->super_CallLogWrapper,gl,log);
  (this->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestBase_015c9490;
  pTVar1 = ctx->m_testCtx;
  (this->m_ctx).m_renderCtx = ctx->m_renderCtx;
  (this->m_ctx).m_testCtx = pTVar1;
  seed = deStringHash(name);
  de::Random::Random(&this->m_rnd,seed);
  glu::CallLogWrapper::enableLogging(&this->super_CallLogWrapper,true);
  return;
}

Assistant:

TestBase::TestBase (const char* name, const char* description, const Context& ctx)
	: TestCase			(ctx.getTestContext(), name, description)
	, CallLogWrapper	(ctx.gl(), ctx.log())
	, m_ctx				(ctx)
	, m_rnd				(deStringHash(name))
{
	enableLogging(true);
}